

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O1

void readTxa<TxaHeaderSwitch>(istream *stream,TxaHeader *header)

{
  pointer pTVar1;
  pointer src;
  size_t len;
  ulong uVar2;
  pointer pTVar3;
  vector<char,_std::allocator<char>_> buffer;
  TxaChunkSwitch c;
  TxaHeaderSwitch h;
  vector<char,_std::allocator<char>_> local_a8;
  ushort local_84;
  uint16_t local_82;
  uint16_t local_80;
  uint16_t local_7e;
  uint32_t local_7c;
  uint32_t local_78;
  uint32_t local_74;
  string local_70;
  undefined1 local_50 [12];
  uint32_t local_44;
  uint local_40;
  undefined8 local_3c;
  
  header->isSwitch = true;
  std::istream::read((char *)stream,(long)local_50);
  header->indexed = local_44;
  header->largestDecodedChunk = (undefined4)local_3c;
  header->indexSize = local_3c._4_4_;
  std::vector<TxaChunk,_std::allocator<TxaChunk>_>::resize(&header->chunks,(ulong)local_40);
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pTVar3 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar1 = (header->chunks).super__Vector_base<TxaChunk,_std::allocator<TxaChunk>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pTVar3 != pTVar1) {
    do {
      std::istream::read((char *)stream,(long)&local_84);
      pTVar3->index = local_82;
      pTVar3->width = local_80;
      pTVar3->height = local_7e;
      pTVar3->offset = local_7c;
      pTVar3->length = local_78;
      pTVar3->decodedLength = local_74;
      uVar2 = (ulong)local_84;
      std::vector<char,_std::allocator<char>_>::resize(&local_a8,uVar2 - 0x13);
      local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar2 - 0x14] = '\0';
      std::istream::read((char *)stream,
                         (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
      src = local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start;
      len = strlen(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
      iconv_convert_abi_cxx11_(&local_70,src,len,iconv_toutf);
      std::__cxx11::string::operator=((string *)&pTVar3->name,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar1);
  }
  if (local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void readTxa(std::istream& stream, TxaHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.indexed = h.indexed.value();
	header.largestDecodedChunk = h.largestDecodedChunk.value();
	header.indexSize = h.getIndexSize();
	header.chunks.resize(h.chunks.value());

	std::vector<char> buffer;

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.index = c.index.value();
		chunk.width = c.width.value();
		chunk.height = c.height.value();
		chunk.offset = c.entryOffset.value();
		chunk.length = c.entryLength.value();
		chunk.decodedLength = c.getDecLength();
		const size_t stringLength = c.headerLength.value() - sizeof(c);
		buffer.resize(stringLength + 1);
		buffer[stringLength] = 0;
		stream.read(buffer.data(), stringLength);
		chunk.name = toUTF8(buffer.data(), strlen(buffer.data()));
	}
}